

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O0

bool __thiscall
ON_InstanceDefinition::RemoveInstanceGeometryId(ON_InstanceDefinition *this,ON_UUID id)

{
  ON_UUID id_00;
  bool bVar1;
  int i_00;
  int iVar2;
  ON_UUID_struct *b;
  int i;
  ON_InstanceDefinition *this_local;
  undefined2 uStack_18;
  undefined2 uStack_16;
  ON_UUID id_local;
  
  id_local._0_8_ = id.Data4;
  register0x00000030 = id._0_8_;
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)((long)&this_local + 4));
  if (((!bVar1) &&
      (id_00.Data4 = (uchar  [8])id_local._0_8_, id_00.Data1 = this_local._4_4_,
      id_00.Data2 = uStack_18, id_00.Data3 = uStack_16,
      i_00 = Internal_InstanceGeometryIdIndex(this,id_00), -1 < i_00)) &&
     (iVar2 = ON_SimpleArray<ON_UUID_struct>::Count(&this->m_object_uuid), i_00 < iVar2)) {
    b = ON_SimpleArray<ON_UUID_struct>::operator[](&this->m_object_uuid,i_00);
    bVar1 = ::operator==((ON_UUID_struct *)((long)&this_local + 4),b);
    if (bVar1) {
      ON_SimpleArray<ON_UUID_struct>::Remove(&this->m_object_uuid,i_00);
      Internal_ContentChanged(this);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_InstanceDefinition::RemoveInstanceGeometryId(ON_UUID id)
{
  if (ON_nil_uuid == id)
    return false;
 int i = Internal_InstanceGeometryIdIndex(id);
 if ( i >= 0 && i < m_object_uuid.Count() && id == m_object_uuid[i])
 {
    m_object_uuid.Remove(i);
    Internal_ContentChanged();
    return true;
  }
  return false;
}